

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

FilterMode vk::mapVkMagTexFilter(VkFilter filter)

{
  undefined4 local_c;
  VkFilter filter_local;
  
  if (filter == VK_FILTER_NEAREST) {
    local_c = NEAREST;
  }
  else if (filter == VK_FILTER_LINEAR) {
    local_c = LINEAR;
  }
  else {
    local_c = FILTERMODE_LAST;
  }
  return local_c;
}

Assistant:

tcu::Sampler::FilterMode mapVkMagTexFilter (VkFilter filter)
{
	switch (filter)
	{
		case VK_FILTER_LINEAR:		return tcu::Sampler::LINEAR;
		case VK_FILTER_NEAREST:		return tcu::Sampler::NEAREST;
		default:
			break;
	}

	DE_ASSERT(false);
	return tcu::Sampler::FILTERMODE_LAST;
}